

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

void __thiscall cmsys::RegExpCompile::reginsert(RegExpCompile *this,char op,char *opnd)

{
  char *place;
  char *dst;
  char *src;
  char *opnd_local;
  char op_local;
  RegExpCompile *this_local;
  
  if (this->regcode == &regdummy) {
    this->regsize = this->regsize + 3;
  }
  else {
    dst = this->regcode;
    this->regcode = this->regcode + 3;
    place = this->regcode;
    while (opnd < dst) {
      place[-1] = dst[-1];
      place = place + -1;
      dst = dst + -1;
    }
    *opnd = op;
    opnd[1] = '\0';
    opnd[2] = '\0';
  }
  return;
}

Assistant:

void RegExpCompile::reginsert(char op, char* opnd)
{
  char* src;
  char* dst;
  char* place;

  if (regcode == regdummyptr) {
    regsize += 3;
    return;
  }

  src = regcode;
  regcode += 3;
  dst = regcode;
  while (src > opnd)
    *--dst = *--src;

  place = opnd; // Op node, where operand used to be.
  *place++ = op;
  *place++ = '\0';
  *place = '\0';
}